

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

int wide_constant_instruction(char *name,Vm *vm,int offset)

{
  uint8_t *puVar1;
  ushort uVar2;
  CrispyValue *pCVar3;
  CrispyValue value;
  uint16_t constant_index;
  uint8_t *code;
  int offset_local;
  Vm *vm_local;
  char *name_local;
  
  puVar1 = ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).code;
  uVar2 = CONCAT11(puVar1[offset + 1],puVar1[offset + 2]);
  printf("%-16s %4d \'",name,(ulong)uVar2);
  pCVar3 = ((vm->frames).frame_pointers[vm->frame_count - 1]->constants).values + uVar2;
  value._4_4_ = 0;
  value.type = pCVar3->type;
  value.field_1.p_value = (pCVar3->field_1).p_value;
  print_value(value,false,false);
  printf("\'\n");
  return offset + 3;
}

Assistant:

static int wide_constant_instruction(const char *name, Vm *vm, int offset) {
    uint8_t *code = CURR_FRAME(vm)->code_buffer.code;
    uint16_t constant_index = (code[offset + 1] << 8) | code[offset + 2];

    printf("%-16s %4d '", name, constant_index);
    print_value(CURR_FRAME(vm)->constants.values[constant_index], false, false);
    printf("'\n");

    return offset + 3;
}